

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dioextra.c
# Opt level: O1

void zone_echo(AREA_DATA_conflict *area,char *echo)

{
  ROOM_INDEX_DATA *pRVar1;
  DESCRIPTOR_DATA **ppDVar2;
  DESCRIPTOR_DATA *pDVar3;
  char buffer [9216];
  char acStack_2428 [9216];
  
  pDVar3 = descriptor_list;
  if (descriptor_list != (DESCRIPTOR_DATA *)0x0) {
    do {
      if (pDVar3->connected == 0) {
        pRVar1 = pDVar3->character->in_room;
        if ((pRVar1 != (ROOM_INDEX_DATA *)0x0) && (pRVar1->area == area)) {
          colorconv(acStack_2428,echo,pDVar3->character);
          send_to_char(acStack_2428,pDVar3->character);
          send_to_char("\n\r",pDVar3->character);
        }
      }
      ppDVar2 = &pDVar3->next;
      pDVar3 = *ppDVar2;
    } while (*ppDVar2 != (DESCRIPTOR_DATA *)0x0);
  }
  return;
}

Assistant:

void zone_echo(AREA_DATA *area, char *echo)
{
	char buffer[MSL * 2];

	for (DESCRIPTOR_DATA *d = descriptor_list; d; d = d->next)
	{
		if (d->connected == CON_PLAYING && d->character->in_room != nullptr && d->character->in_room->area == area)
		{
			colorconv(buffer, echo, d->character);
			send_to_char(buffer, d->character);
			send_to_char("\n\r", d->character);
		}
	}
}